

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht-spkitable.c
# Opt level: O0

void spki_table_swap(spki_table *a,spki_table *b)

{
  tommy_list ptVar1;
  long in_FS_OFFSET;
  spki_table *b_local;
  spki_table *a_local;
  tommy_list tmp_list;
  tommy_hashlin tmp_hashtable;
  
  tmp_hashtable._280_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  pthread_rwlock_wrlock((pthread_rwlock_t *)&a->lock);
  pthread_rwlock_wrlock((pthread_rwlock_t *)&b->lock);
  memcpy(&tmp_list,a,0x120);
  ptVar1 = a->list;
  memcpy(a,b,0x120);
  a->list = b->list;
  memcpy(b,&tmp_list,0x120);
  b->list = ptVar1;
  pthread_rwlock_unlock((pthread_rwlock_t *)&a->lock);
  pthread_rwlock_unlock((pthread_rwlock_t *)&b->lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == tmp_hashtable._280_8_) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void spki_table_swap(struct spki_table *a, struct spki_table *b)
{
	tommy_hashlin tmp_hashtable;
	tommy_list tmp_list;

	pthread_rwlock_wrlock(&a->lock);
	pthread_rwlock_wrlock(&b->lock);

	memcpy(&tmp_hashtable, &a->hashtable, sizeof(tmp_hashtable));
	memcpy(&tmp_list, &a->list, sizeof(tmp_list));

	memcpy(&a->hashtable, &b->hashtable, sizeof(tmp_hashtable));
	memcpy(&a->list, &b->list, sizeof(tmp_list));

	memcpy(&b->hashtable, &tmp_hashtable, sizeof(tmp_hashtable));
	memcpy(&b->list, &tmp_list, sizeof(tmp_list));

	pthread_rwlock_unlock(&a->lock);
	pthread_rwlock_unlock(&b->lock);
}